

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall xemmai::ast::t_block::f_next(t_block *this,t_block *a_next)

{
  t_block *local_20;
  t_block *local_18;
  t_block *a_next_local;
  t_block *this_local;
  
  local_20 = this;
  local_18 = a_next;
  a_next_local = this;
  std::vector<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>::push_back
            (&a_next->v_previouses,&local_20);
  std::vector<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>::push_back
            (&this->v_nexts,&local_18);
  return;
}

Assistant:

void f_next(t_block* a_next)
	{
		a_next->v_previouses.push_back(this);
		v_nexts.push_back(a_next);
	}